

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall
font2svg::glyph::svgborder_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<((ostream *)&this->field_0x270,"\n\n <!-- draw border -->");
  poVar1 = std::operator<<((ostream *)&this->field_0x270,"\n <rect fill=\'none\' stroke=\'black\'");
  poVar1 = std::operator<<(poVar1," width=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbwidth + -1);
  poVar1 = std::operator<<(poVar1,"\'");
  poVar1 = std::operator<<(poVar1," height=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight + -1);
  std::operator<<(poVar1,"\'/>");
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgborder()  {
		tmp.str("");
		tmp << "\n\n <!-- draw border -->";

		tmp << "\n <rect fill='none' stroke='black'"
			<< " width='" << bbwidth - 1 << "'"
			<< " height='" << bbheight - 1 << "'/>";
		return tmp.str();
	}